

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_frame.hpp
# Opt level: O1

void __thiscall DSFrame::DSFrame(DSFrame *this,DSFrame *old)

{
  code *pcVar1;
  long *plVar2;
  
  this->StrideBytes = (int *)0x0;
  this->DstPointers = (uchar **)0x0;
  this->FrameWidth = 0;
  this->FrameHeight = 0;
  this->SrcPointers = (uchar **)0x0;
  (this->Format).IsFamilyYUV = true;
  (this->Format).IsFamilyRGB = false;
  (this->Format).IsFamilyYCC = false;
  (this->Format).IsInteger = true;
  (this->Format).IsFloat = false;
  (this->Format).SSW = 0;
  (this->Format).SSH = 0;
  (this->Format).BitsPerSample = 8;
  (this->Format).BytesPerSample = 1;
  (this->Format).Planes = 3;
  this->_vssrc = (VSFrameRef *)0x0;
  this->_vsdst = (VSFrameRef *)0x0;
  this->_vscore = (VSCore *)0x0;
  this->_vsapi = (VSAPI *)0x0;
  this->_vsformat = (VSFormat *)0x0;
  if ((AVS_linkage != (AVS_Linkage *)0x0) && (1000 < (uint)AVS_linkage->Size)) {
    pcVar1 = (code *)AVS_linkage->PVideoFrame_CONSTRUCTOR0;
    if (((ulong)pcVar1 & 1) != 0) {
      pcVar1 = *(code **)(pcVar1 + *(long *)((long)this->planes_y +
                                            *(long *)&AVS_linkage->field_0x3f0 + -0x40) + -1);
    }
    (*pcVar1)();
  }
  this->_env = (IScriptEnvironment *)0x0;
  this->planes_y[0] = 1;
  this->planes_y[1] = 2;
  this->planes_y[2] = 4;
  this->planes_y[3] = 0x10;
  this->planes_r[0] = 0x20;
  this->planes_r[1] = 0x40;
  this->planes_r[2] = 0x80;
  this->planes_r[3] = 0x10;
  this->planes = (int *)0x0;
  if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x428 < (uint)AVS_linkage->Size)) {
    pcVar1 = (code *)AVS_linkage->PVideoFrame_OPERATOR_ASSIGN1;
    plVar2 = (long *)((long)this->planes_y + *(long *)&AVS_linkage->field_0x430 + -0x40);
    if (((ulong)pcVar1 & 1) != 0) {
      pcVar1 = *(code **)(pcVar1 + *plVar2 + -1);
    }
    (*pcVar1)(plVar2,&old->_avssrc);
  }
  memcpy(this,old,0xd0);
  old->SrcPointers = (uchar **)0x0;
  old->StrideBytes = (int *)0x0;
  old->DstPointers = (uchar **)0x0;
  old->_vssrc = (VSFrameRef *)0x0;
  old->_vsdst = (VSFrameRef *)0x0;
  return;
}

Assistant:

DSFrame(DSFrame && old) noexcept
  {
    _avssrc = old._avssrc;
    std::memcpy(this, &old, sizeof(DSFrame));
    old.SrcPointers = nullptr;
    old.DstPointers = nullptr;
    old.StrideBytes = nullptr;
    old._vssrc = nullptr;
    old._vsdst = nullptr;
  }